

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O1

uint solver_clause_create(solver_t *s,vec_uint_t *lits,uint f_learnt)

{
  long *plVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  vec_uint_t *pvVar8;
  ulong uVar9;
  uint uVar10;
  
  if (lits->size < 2) {
    __assert_fail("vec_uint_size(lits) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1e9,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  if (1 < f_learnt) {
    __assert_fail("f_learnt == 0 || f_learnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1ea,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  uVar3 = cdb_append(s->all_clauses,f_learnt + lits->size + 3);
  if (uVar3 == 0xffffffff) {
    puVar7 = (uint *)0x0;
  }
  else {
    puVar7 = s->all_clauses->data + uVar3;
  }
  *puVar7 = (*puVar7 & 0xfffffff0) + f_learnt * 8 | f_learnt;
  uVar5 = lits->size;
  puVar7[1] = uVar5;
  if (lits == (vec_uint_t *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0x9a,"unsigned int *vec_uint_data(vec_uint_t *)");
  }
  memcpy(puVar7 + 2,lits->data,(ulong)uVar5 << 2);
  if (f_learnt == 0) {
    pvVar8 = s->originals;
    uVar5 = pvVar8->cap;
    if (pvVar8->size == uVar5) {
      if (uVar5 < 0x10) {
        puVar7 = (uint *)realloc(pvVar8->data,0x40);
        pvVar8->data = puVar7;
        uVar5 = 0x10;
        if (puVar7 == (uint *)0x0) goto LAB_008fb30e;
      }
      else {
        if ((int)uVar5 < 1) goto LAB_008fb267;
        puVar7 = (uint *)realloc(pvVar8->data,(ulong)uVar5 * 8);
        pvVar8->data = puVar7;
        if (puVar7 == (uint *)0x0) goto LAB_008fb30e;
        uVar5 = uVar5 * 2;
      }
      pvVar8->cap = uVar5;
    }
LAB_008fb267:
    pvVar8->data[pvVar8->size] = uVar3;
    pvVar8->size = pvVar8->size + 1;
    plVar1 = &(s->stats).n_original_lits;
    *plVar1 = *plVar1 + (ulong)lits->size;
    return uVar3;
  }
  pvVar8 = s->learnts;
  uVar5 = pvVar8->cap;
  if (pvVar8->size == uVar5) {
    if (uVar5 < 0x10) {
      puVar6 = (uint *)realloc(pvVar8->data,0x40);
      pvVar8->data = puVar6;
      uVar5 = 0x10;
      if (puVar6 == (uint *)0x0) {
LAB_008fb30e:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar5 < 1) goto LAB_008fb142;
      puVar6 = (uint *)realloc(pvVar8->data,(ulong)uVar5 * 8);
      pvVar8->data = puVar6;
      if (puVar6 == (uint *)0x0) goto LAB_008fb30e;
      uVar5 = uVar5 * 2;
    }
    pvVar8->cap = uVar5;
  }
LAB_008fb142:
  pvVar8->data[pvVar8->size] = uVar3;
  pvVar8->size = pvVar8->size + 1;
  puVar6 = lits->data;
  uVar5 = lits->size;
  s->cur_stamp = s->cur_stamp + 1;
  if ((ulong)uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    pvVar8 = s->levels;
    uVar9 = 0;
    iVar4 = 0;
    do {
      uVar10 = puVar6[uVar9] >> 1;
      if (pvVar8->size <= uVar10) {
LAB_008fb292:
        __assert_fail("idx >= 0 && idx < p->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x85,"unsigned int vec_uint_at(vec_uint_t *, unsigned int)");
      }
      uVar10 = pvVar8->data[uVar10];
      if (s->stamps->size <= uVar10) goto LAB_008fb292;
      puVar2 = s->stamps->data;
      if (puVar2[uVar10] != s->cur_stamp) {
        puVar2[uVar10] = s->cur_stamp;
        iVar4 = iVar4 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
    uVar5 = iVar4 << 4;
  }
  uVar10 = puVar7[1];
  *puVar7 = *puVar7 & 0xf | uVar5;
  puVar7[(ulong)uVar10 + 2] = 0;
  plVar1 = &(s->stats).n_learnt_lits;
  *plVar1 = *plVar1 + (ulong)lits->size;
  puVar7 = puVar7 + (ulong)uVar10 + 2;
  *puVar7 = *puVar7 + s->clause_act_inc;
  if ((int)*puVar7 < 0) {
    pvVar8 = s->learnts;
    if (pvVar8->size != 0) {
      uVar9 = 0;
      do {
        puVar7 = s->all_clauses->data;
        puVar7 = puVar7 + (ulong)pvVar8->data[uVar9] +
                          (ulong)puVar7[(ulong)pvVar8->data[uVar9] + 1] + 2;
        *puVar7 = *puVar7 >> 10;
        uVar9 = uVar9 + 1;
        pvVar8 = s->learnts;
      } while (uVar9 < pvVar8->size);
    }
    uVar10 = s->clause_act_inc >> 10;
    uVar5 = 0x800;
    if (0x800 < uVar10) {
      uVar5 = uVar10;
    }
    s->clause_act_inc = uVar5;
  }
  return uVar3;
}

Assistant:

unsigned solver_clause_create(solver_t *s, vec_uint_t *lits, unsigned f_learnt)
{
    struct clause *clause;
    unsigned cref;
    unsigned n_words;

    assert(vec_uint_size(lits) > 1);
    assert(f_learnt == 0 || f_learnt == 1);

    n_words = 3 + f_learnt + vec_uint_size(lits);
    cref = cdb_append(s->all_clauses, n_words);
    clause = clause_fetch(s, cref);
    clause->f_learnt = f_learnt;
    clause->f_mark = 0;
    clause->f_reallocd = 0;
    clause->f_deletable = f_learnt;
    clause->size = vec_uint_size(lits);
    memcpy(&(clause->data[0].lit), vec_uint_data(lits), sizeof(unsigned) * vec_uint_size(lits));

    if (f_learnt) {
        vec_uint_push_back(s->learnts, cref);
        clause->lbd = clause_clac_lbd(s, vec_uint_data(lits), vec_uint_size(lits));
        clause->data[clause->size].act = 0;
        s->stats.n_learnt_lits += vec_uint_size(lits);
        clause_act_bump(s, clause);
    } else {
        vec_uint_push_back(s->originals, cref);
        s->stats.n_original_lits += vec_uint_size(lits);
    }
    return cref;
}